

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::
unordered_flat_set<slang::parsing::KnownSystemName,slang::hash<slang::parsing::KnownSystemName,void>,std::equal_to<slang::parsing::KnownSystemName>,std::allocator<slang::parsing::KnownSystemName>>
::unordered_flat_set<slang::parsing::KnownSystemName_const*>
          (unordered_flat_set<slang::parsing::KnownSystemName,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
           *this,KnownSystemName *first,KnownSystemName *last,size_type n,hasher *h,key_equal *pred,
          allocator_type *a)

{
  key_equal *in_RDI;
  unordered_flat_set<slang::parsing::KnownSystemName,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
  *in_R9;
  KnownSystemName *unaff_retaddr;
  unordered_flat_set<slang::parsing::KnownSystemName,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
  *in_stack_00000008;
  hasher *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  
  unordered_flat_set<slang::parsing::KnownSystemName,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
  ::unordered_flat_set
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI,
             (allocator_type *)0x6877a9);
  insert<slang::parsing::KnownSystemName_const*>
            (in_stack_00000008,unaff_retaddr,(KnownSystemName *)in_RDI);
  return;
}

Assistant:

unordered_flat_set(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_set(n, h, pred, a) {
        this->insert(first, last);
    }